

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O2

uint32 * rw::ps2::instanceUV(uint32 *p,Geometry *g,Mesh *m,uint32 idx,uint32 n)

{
  ushort uVar1;
  TexCoords *pTVar2;
  ulong uVar3;
  float32 *pfVar4;
  uint uVar5;
  
  uVar5 = n + idx;
  if ((g->flags & 0x84) == 0) {
    for (; pfVar4 = (float32 *)p, idx < uVar5; idx = idx + 1) {
      ((float32 *)p)[0] = 0.0;
      ((float32 *)p)[1] = 0.0;
      p = (uint32 *)((float32 *)p + 2);
    }
  }
  else {
    pTVar2 = g->texCoords[0];
    for (uVar3 = (ulong)idx; pfVar4 = (float32 *)p, uVar3 < uVar5; uVar3 = uVar3 + 1) {
      uVar1 = m->indices[uVar3];
      *p = (uint32)pTVar2[uVar1].u;
      ((float32 *)p)[1] = pTVar2[uVar1].v;
      p = (uint32 *)((float32 *)p + 2);
    }
  }
  for (; ((ulong)pfVar4 & 0xf) != 0; pfVar4 = pfVar4 + 1) {
    *p = 0;
    p = (uint32 *)((float32 *)p + 1);
  }
  return p;
}

Assistant:

uint32*
instanceUV(uint32 *p, Geometry *g, Mesh *m, uint32 idx, uint32 n)
{
	uint16 j;
	uint32 *d = (uint32*)g->texCoords[0];
	if((g->flags & Geometry::TEXTURED) ||
	   (g->flags & Geometry::TEXTURED2))
		for(uint32 i = idx; i < idx+n; i++){
			j = m->indices[i];
			*p++ = d[j*2+0];
			*p++ = d[j*2+1];
		}
	else
		for(uint32 i = idx; i < idx+n; i++){
			*p++ = 0;
			*p++ = 0;
		}
	while((uintptr)p % 0x10)
		*p++ = 0;
	return p;
}